

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkTSDA::IntStateGather
          (ChLinkTSDA *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  int iVar14;
  Index size_1;
  long lVar15;
  ulong uVar16;
  Index size;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  
  iVar13 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])()
  ;
  if (((char)iVar13 == '\0') || (this->m_variables == (ChVariablesGenericDiagonalMass *)0x0)) {
    return;
  }
  uVar17 = (ulong)this->m_nstates;
  pdVar4 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar4 != (double *)0x0 && (long)uVar17 < 0) {
LAB_0059d1b5:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if ((-1 < this->m_nstates) &&
     ((long)(ulong)off_x <=
      (long)((x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
            uVar17))) {
    pdVar4 = pdVar4 + off_x;
    uVar16 = uVar17;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar17 <= uVar16)) {
      uVar16 = uVar17;
    }
    lVar21 = uVar17 - uVar16;
    iVar13 = (int)lVar21;
    iVar14 = iVar13 + 7;
    if (-1 < iVar13) {
      iVar14 = iVar13;
    }
    lVar22 = (long)(iVar14 >> 3);
    if (uVar16 != 0) {
      memset(pdVar4,0,uVar16 * 8);
    }
    lVar1 = uVar16 + lVar22 * 8;
    if (7 < lVar21) {
      lVar15 = uVar16 + 8;
      if ((long)(uVar16 + 8) < lVar1) {
        lVar15 = lVar1;
      }
      memset(pdVar4 + uVar16,0,(~uVar16 + lVar15 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar17) {
      memset(pdVar4 + lVar22 * 8 + uVar16,0,(lVar21 + lVar22 * -8) * 8);
    }
    uVar17 = (ulong)this->m_nstates;
    pdVar4 = (v->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if (pdVar4 != (double *)0x0 && (long)uVar17 < 0) goto LAB_0059d1b5;
    if ((-1 < this->m_nstates) &&
       ((long)(ulong)off_v <=
        (long)((v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar17))) {
      if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows == uVar17) {
        pdVar4 = pdVar4 + off_v;
        uVar16 = uVar17;
        if ((((ulong)pdVar4 & 7) == 0) &&
           (uVar16 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7),
           (long)uVar17 <= (long)uVar16)) {
          uVar16 = uVar17;
        }
        pdVar5 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar19 = uVar17 - uVar16;
        uVar18 = uVar19 + 7;
        if (-1 < (long)uVar19) {
          uVar18 = uVar19;
        }
        if (0 < (long)uVar16) {
          uVar20 = 0;
          do {
            pdVar4[uVar20] = pdVar5[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar16 != uVar20);
        }
        uVar18 = (uVar18 & 0xfffffffffffffff8) + uVar16;
        if (7 < (long)uVar19) {
          do {
            pdVar2 = pdVar5 + uVar16;
            dVar6 = pdVar2[1];
            dVar7 = pdVar2[2];
            dVar8 = pdVar2[3];
            dVar9 = pdVar2[4];
            dVar10 = pdVar2[5];
            dVar11 = pdVar2[6];
            dVar12 = pdVar2[7];
            pdVar3 = pdVar4 + uVar16;
            *pdVar3 = *pdVar2;
            pdVar3[1] = dVar6;
            pdVar3[2] = dVar7;
            pdVar3[3] = dVar8;
            pdVar3[4] = dVar9;
            pdVar3[5] = dVar10;
            pdVar3[6] = dVar11;
            pdVar3[7] = dVar12;
            uVar16 = uVar16 + 8;
          } while ((long)uVar16 < (long)uVar18);
        }
        if ((long)uVar18 < (long)uVar17) {
          do {
            pdVar4[uVar18] = pdVar5[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        *T = (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
        return;
      }
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLinkTSDA::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                ChState& x,                // state vector, position part
                                const unsigned int off_v,  // offset in v state vector
                                ChStateDelta& v,           // state vector, speed part
                                double& T                  // time
) {
    if (!IsActive())
        return;

    if (m_variables) {
        x.segment(off_x, m_nstates).setZero();
        v.segment(off_v, m_nstates) = m_states;
        T = GetChTime();
    }
}